

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args_test.c
# Opt level: O0

void test_attached_long_colon(void)

{
  nng_err num;
  int iVar1;
  char *pcVar2;
  char *pcStack_38;
  nng_err result_;
  char *a;
  int v;
  int ac;
  char *av [3];
  int opti;
  
  av[2]._4_4_ = 1;
  a._4_4_ = 3;
  pcStack_38 = (char *)0x0;
  _v = "program";
  av[0] = "--value:123";
  av[1] = "456";
  num = nng_args_parse(3,(char **)&v,case1,(int *)&a,&stack0xffffffffffffffc8,
                       (int *)((long)av + 0x14));
  pcVar2 = nng_strerror(num);
  iVar1 = acutest_check_((uint)(num == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                         ,0x85,"%s: expected success, got %s (%d)",
                         "nng_args_parse(ac, av, case1, &v, &a, &opti)",pcVar2,num);
  if (iVar1 == 0) {
    acutest_abort_();
  }
  acutest_check_((uint)(av[2]._4_4_ == 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x86,"%s","opti == 2");
  acutest_check_((uint)((int)a == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x87,"%s","v == 3");
  iVar1 = strcmp(pcStack_38,"123");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x88,"%s == %s",pcStack_38,"123",num);
  iVar1 = nng_args_parse(a._4_4_,(char **)&v,case1,(int *)&a,&stack0xffffffffffffffc8,
                         (int *)((long)av + 0x14));
  acutest_check_((uint)(iVar1 == -1),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x89,"%s","nng_args_parse(ac, av, case1, &v, &a, &opti) == -1");
  acutest_check_((uint)(av[2]._4_4_ == 2),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x8a,"%s","opti == 2");
  iVar1 = strcmp(*(char **)(&v + (long)av[2]._4_4_ * 2),"456");
  acutest_check_((uint)(iVar1 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/args_test.c"
                 ,0x8b,"%s == %s",*(undefined8 *)(&v + (long)av[2]._4_4_ * 2),"456");
  return;
}

Assistant:

void
test_attached_long_colon(void)
{
	int   opti = 1;
	char *av[3];
	int   ac = 3;
	int   v;
	char *a = NULL;

	av[0] = "program";
	av[1] = "--value:123";
	av[2] = "456";
	NUTS_PASS(nng_args_parse(ac, av, case1, &v, &a, &opti));
	NUTS_TRUE(opti == 2);
	NUTS_TRUE(v == 3);
	NUTS_MATCH(a, "123");
	NUTS_TRUE(nng_args_parse(ac, av, case1, &v, &a, &opti) == -1);
	NUTS_TRUE(opti == 2);
	NUTS_MATCH(av[opti], "456");
}